

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 sqlite3VdbeSerialType(Mem *pMem,int file_format,u32 *pLen)

{
  ushort uVar1;
  MemValue MVar2;
  u32 uVar3;
  ulong uVar4;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 1) != 0) {
    *pLen = 0;
    return 0;
  }
  if ((uVar1 & 4) == 0) {
    if ((uVar1 & 8) == 0) {
      uVar3 = pMem->n;
      if ((uVar1 >> 0xe & 1) != 0) {
        uVar3 = uVar3 + (pMem->u).nZero;
      }
      *pLen = uVar3;
      return (uVar1 >> 1 & 1) + uVar3 * 2 + 0xc;
    }
    *pLen = 8;
    uVar3 = 7;
  }
  else {
    MVar2 = pMem->u;
    uVar4 = MVar2.i >> 0x3f ^ MVar2.i;
    if (uVar4 < 0x80) {
      if (3 < file_format && MVar2.zPType < (char *)0x2) {
        *pLen = 0;
        return MVar2.nZero | 8;
      }
      *pLen = 1;
      uVar3 = 1;
    }
    else if (uVar4 < 0x8000) {
      *pLen = 2;
      uVar3 = 2;
    }
    else if (uVar4 < 0x800000) {
      *pLen = 3;
      uVar3 = 3;
    }
    else if (uVar4 < 0x80000000) {
      *pLen = 4;
      uVar3 = 4;
    }
    else if (uVar4 >> 0x2f == 0) {
      *pLen = 6;
      uVar3 = 5;
    }
    else {
      *pLen = 8;
      uVar3 = 6;
    }
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3VdbeSerialType(Mem *pMem, int file_format, u32 *pLen){
  int flags = pMem->flags;
  u32 n;

  assert( pLen!=0 );
  if( flags&MEM_Null ){
    *pLen = 0;
    return 0;
  }
  if( flags&MEM_Int ){
    /* Figure out whether to use 1, 2, 4, 6 or 8 bytes. */
#   define MAX_6BYTE ((((i64)0x00008000)<<32)-1)
    i64 i = pMem->u.i;
    u64 u;
    if( i<0 ){
      u = ~i;
    }else{
      u = i;
    }
    if( u<=127 ){
      if( (i&1)==i && file_format>=4 ){
        *pLen = 0;
        return 8+(u32)u;
      }else{
        *pLen = 1;
        return 1;
      }
    }
    if( u<=32767 ){ *pLen = 2; return 2; }
    if( u<=8388607 ){ *pLen = 3; return 3; }
    if( u<=2147483647 ){ *pLen = 4; return 4; }
    if( u<=MAX_6BYTE ){ *pLen = 6; return 5; }
    *pLen = 8;
    return 6;
  }
  if( flags&MEM_Real ){
    *pLen = 8;
    return 7;
  }
  assert( pMem->db->mallocFailed || flags&(MEM_Str|MEM_Blob) );
  assert( pMem->n>=0 );
  n = (u32)pMem->n;
  if( flags & MEM_Zero ){
    n += pMem->u.nZero;
  }
  *pLen = n;
  return ((n*2) + 12 + ((flags&MEM_Str)!=0));
}